

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_parser.hpp
# Opt level: O1

SPIRString * __thiscall
spirv_cross::Parser::set<spirv_cross::SPIRString,std::__cxx11::string>
          (Parser *this,uint32_t id,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  Variant *this_00;
  SPIRString *val;
  
  ParsedIR::add_typed_id(&this->ir,TypeString,(ID)id);
  this_00 = (this->ir).ids.super_VectorView<spirv_cross::Variant>.ptr + id;
  val = ObjectPool<spirv_cross::SPIRString>::allocate<std::__cxx11::string>
                  ((ObjectPool<spirv_cross::SPIRString> *)
                   this_00->group->pools[0xd]._M_t.
                   super___uniq_ptr_impl<spirv_cross::ObjectPoolBase,_std::default_delete<spirv_cross::ObjectPoolBase>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_spirv_cross::ObjectPoolBase_*,_std::default_delete<spirv_cross::ObjectPoolBase>_>
                   .super__Head_base<0UL,_spirv_cross::ObjectPoolBase_*,_false>._M_head_impl,args);
  Variant::set(this_00,&val->super_IVariant,TypeString);
  (val->super_IVariant).self.id = id;
  return val;
}

Assistant:

T &set(uint32_t id, P &&... args)
	{
		ir.add_typed_id(static_cast<Types>(T::type), id);
		auto &var = variant_set<T>(ir.ids[id], std::forward<P>(args)...);
		var.self = id;
		return var;
	}